

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

bool __thiscall
HighsHashTree<std::pair<int,_int>,_double>::contains
          (HighsHashTree<std::pair<int,_int>,_double> *this,pair<int,_int> *key)

{
  ValueType *pVVar1;
  uint64_t hash;
  pair<int,_int> *in_stack_00000040;
  int in_stack_0000004c;
  uint64_t in_stack_00000050;
  NodePtr in_stack_00000058;
  
  compute_hash((pair<int,_int> *)0x73dbe1);
  pVVar1 = find_recurse(in_stack_00000058,in_stack_00000050,in_stack_0000004c,in_stack_00000040);
  return pVVar1 != (ValueType *)0x0;
}

Assistant:

bool contains(const K& key) const {
    uint64_t hash = compute_hash(key);
    return find_recurse(root, hash, 0, key) != nullptr;
  }